

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

Var __thiscall Js::InterpreterStackFrame::OP_LdLocalObj(InterpreterStackFrame *this)

{
  long lVar1;
  
  lVar1 = **(long **)(this + 0x58);
  if ((lVar1 != VirtualTableInfo<Js::ActivationObject>::Address) &&
     (lVar1 != VirtualTableInfo<Js::ActivationObjectEx>::Address)) {
    Throw::FatalInternalError(-0x7fffbffb);
  }
  return *(long **)(this + 0x58);
}

Assistant:

Var InterpreterStackFrame::OP_LdLocalObj()
    {
        if (!VirtualTableInfo<ActivationObject>::HasVirtualTable(this->localClosure) &&
            !VirtualTableInfo<ActivationObjectEx>::HasVirtualTable(this->localClosure))
        {
            Js::Throw::FatalInternalError();
        }
        return this->localClosure;
    }